

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c++
# Opt level: O0

Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> __thiscall
kj::TlsNetwork::parseAddress(TlsNetwork *this,StringPtr addr,uint portHint)

{
  undefined8 *puVar1;
  bool bVar2;
  NullableValue<unsigned_long> *pNVar3;
  unsigned_long *puVar4;
  String *pSVar5;
  undefined4 in_register_0000000c;
  char *pcVar6;
  size_t sVar7;
  undefined4 in_R8D;
  StringPtr value;
  StringPtr value_00;
  ArrayPtr<const_char> value_01;
  StringPtr value_02;
  bool local_25a;
  char *local_228;
  String local_220;
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  Type local_1f0;
  String local_1d0;
  ArrayPtr<const_char> local_1b8;
  String local_1a8;
  unsigned_long *local_190;
  unsigned_long *pos_1;
  undefined1 local_178 [8];
  NullableValue<unsigned_long> _pos707;
  String local_150;
  char local_131;
  char *pcStack_130;
  char c;
  char *__end4;
  char *__begin4;
  StringPtr *__range4;
  uint colons;
  Fault f;
  StringPtr local_f8;
  TlsNetwork *local_e8;
  char *pcStack_e0;
  String local_d0;
  ArrayPtr<const_char> local_b8;
  String local_a8;
  EventLoop *local_90;
  unsigned_long *pos;
  undefined1 local_78 [8];
  NullableValue<unsigned_long> _pos676;
  StringPtr local_58;
  undefined1 local_48 [8];
  String hostname;
  uint portHint_local;
  TlsNetwork *this_local;
  StringPtr addr_local;
  
  pcVar6 = (char *)CONCAT44(in_register_0000000c,portHint);
  this_local = (TlsNetwork *)addr.content.size_;
  hostname.content.disposer._4_4_ = in_R8D;
  addr_local.content.ptr = pcVar6;
  addr_local.content.size_ = (size_t)this;
  String::String((String *)local_48);
  StringPtr::StringPtr(&local_58,"[");
  bVar2 = StringPtr::startsWith((StringPtr *)&this_local,&local_58);
  if (bVar2) {
    StringPtr::findFirst((StringPtr *)&pos,(char)&this_local);
    pNVar3 = kj::_::readMaybe<unsigned_long>((Maybe<unsigned_long> *)&pos);
    kj::_::NullableValue<unsigned_long>::NullableValue
              ((NullableValue<unsigned_long> *)local_78,pNVar3);
    Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&pos);
    puVar4 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_78);
    if (puVar4 == (unsigned_long *)0x0) {
      local_e8 = this_local;
      pcStack_e0 = addr_local.content.ptr;
      value.content.size_ = (size_t)pcVar6;
      value.content.ptr = addr_local.content.ptr;
      heapString(&local_d0,(kj *)this_local,value);
      String::operator=((String *)local_48,&local_d0);
      String::~String(&local_d0);
    }
    else {
      local_90 = (EventLoop *)
                 kj::_::NullableValue<unsigned_long>::operator*
                           ((NullableValue<unsigned_long> *)local_78);
      local_b8 = StringPtr::slice((StringPtr *)&this_local,1,(size_t)(local_90->port).ptr);
      str<kj::ArrayPtr<char_const>>
                (&local_a8,(kj *)&local_b8,(ArrayPtr<const_char> *)local_b8.size_);
      String::operator=((String *)local_48,&local_a8);
      String::~String(&local_a8);
    }
    kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_78);
  }
  else {
    StringPtr::StringPtr(&local_f8,"unix:");
    bVar2 = StringPtr::startsWith((StringPtr *)&this_local,&local_f8);
    sVar7 = CONCAT71((int7)((ulong)pcVar6 >> 8),bVar2);
    local_25a = true;
    if (!bVar2) {
      StringPtr::StringPtr((StringPtr *)&f,"unix-abstract:");
      local_25a = StringPtr::startsWith((StringPtr *)&this_local,(StringPtr *)&f);
    }
    if (local_25a != false) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[47],kj::StringPtr&>
                ((Fault *)&stack0xfffffffffffffef0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++"
                 ,0x2ae,FAILED,(char *)0x0,
                 "\"can\'t authenticate Unix domain socket with TLS\", addr",
                 (char (*) [47])"can\'t authenticate Unix domain socket with TLS",
                 (StringPtr *)&this_local);
      kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffef0);
    }
    __range4._4_4_ = 0;
    __begin4 = (char *)&this_local;
    __end4 = StringPtr::begin((StringPtr *)__begin4);
    pcStack_130 = StringPtr::end((StringPtr *)__begin4);
    for (; __end4 != pcStack_130; __end4 = __end4 + 1) {
      local_131 = *__end4;
      if (local_131 == ':') {
        __range4._4_4_ = __range4._4_4_ + 1;
      }
    }
    if (__range4._4_4_ < 2) {
      StringPtr::findFirst((StringPtr *)&pos_1,(char)&this_local);
      pNVar3 = kj::_::readMaybe<unsigned_long>((Maybe<unsigned_long> *)&pos_1);
      kj::_::NullableValue<unsigned_long>::NullableValue
                ((NullableValue<unsigned_long> *)local_178,pNVar3);
      Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&pos_1);
      puVar4 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_178);
      if (puVar4 == (unsigned_long *)0x0) {
        local_1f0.hostname.content.ptr = (char *)this_local;
        local_1f0.hostname.content.size_ = (size_t)addr_local.content.ptr;
        value_02.content.size_ = sVar7;
        value_02.content.ptr = addr_local.content.ptr;
        heapString(&local_1d0,(kj *)this_local,value_02);
        String::operator=((String *)local_48,&local_1d0);
        String::~String(&local_1d0);
      }
      else {
        local_190 = kj::_::NullableValue<unsigned_long>::operator*
                              ((NullableValue<unsigned_long> *)local_178);
        local_1b8 = StringPtr::first((StringPtr *)&this_local,*local_190);
        value_01.ptr = (char *)local_1b8.size_;
        value_01.size_ = (size_t)local_1b8.ptr;
        heapString(&local_1a8,(kj *)local_1b8.ptr,value_01);
        String::operator=((String *)local_48,&local_1a8);
        String::~String(&local_1a8);
      }
      kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_178)
      ;
    }
    else {
      _pos707.field_1 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)this_local;
      value_00.content.size_ = sVar7;
      value_00.content.ptr = addr_local.content.ptr;
      heapString(&local_150,(kj *)this_local,value_00);
      String::operator=((String *)local_48,&local_150);
      String::~String(&local_150);
    }
  }
  puVar1 = *(undefined8 **)(addr.content.ptr + 0x10);
  local_208 = this_local._0_4_;
  uStack_204 = this_local._4_4_;
  uStack_200 = addr_local.content.ptr._0_4_;
  uStack_1fc = addr_local.content.ptr._4_4_;
  (**(code **)*puVar1)
            (&local_1f0,puVar1,this_local,addr_local.content.ptr,hostname.content.disposer._4_4_);
  local_228 = addr.content.ptr;
  pSVar5 = mv<kj::String>((String *)local_48);
  String::String(&local_220,pSVar5);
  Promise<kj::Own<kj::NetworkAddress,decltype(nullptr)>>::
  then<kj::TlsNetwork::parseAddress(kj::StringPtr,unsigned_int)::_lambda(kj::Own<kj::NetworkAddress,decltype(nullptr)>&&)_1_>
            ((Promise<kj::Own<kj::NetworkAddress,decltype(nullptr)>> *)this,&local_1f0);
  parseAddress(kj::StringPtr,unsigned_int)::
  {lambda(kj::Own<kj::NetworkAddress,decltype(nullptr)>&&)#1}::~Own
            ((_lambda_kj__Own<kj::NetworkAddress,decltype(nullptr)>____1_ *)&local_228);
  Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>::~Promise
            ((Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *)&local_1f0);
  String::~String((String *)local_48);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<Own<NetworkAddress>> parseAddress(StringPtr addr, uint portHint) override {
    // We want to parse the hostname or IP address out of `addr`. This is a bit complicated as
    // KJ's default network implementation has a fairly featureful grammar for these things.
    // In particular, we cannot just split on ':' because the address might be IPv6.

    kj::String hostname;

    if (addr.startsWith("[")) {
      // IPv6, like "[1234:5678::abcd]:123". Take the part between the brackets.
      KJ_IF_SOME(pos, addr.findFirst(']')) {
        hostname = kj::str(addr.slice(1, pos));
      } else {
        // Uhh??? Just take the whole thing, cert will fail later.
        hostname = kj::heapString(addr);
      }
    }